

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QStyleSheetStyle::repolish(QStyleSheetStyle *this,QWidget *w)

{
  bool bVar1;
  QObjectList *this_00;
  const_iterator o;
  QList<const_QObject_*> *in_RSI;
  long in_FS_OFFSET;
  QObject *child;
  add_const_t<const_QList<QObject_*>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<const_QObject_*> children;
  parameter_type in_stack_ffffffffffffff98;
  QList<QObject_*> *in_stack_ffffffffffffffa0;
  QList<const_QObject_*> *in_stack_ffffffffffffffc8;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<const_QObject_*>::QList((QList<const_QObject_*> *)0x42c35e);
  this_00 = QObject::children((QObject *)0x42c368);
  QList<QObject_*>::size(this_00);
  QList<const_QObject_*>::reserve(in_stack_ffffffffffffffc8,(qsizetype)child);
  QObject::children((QObject *)0x42c39a);
  local_28.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QObject_*>::begin(in_stack_ffffffffffffffa0);
  o = QList<QObject_*>::end(in_stack_ffffffffffffffa0);
  while( true ) {
    bVar1 = QList<QObject_*>::const_iterator::operator!=(&local_28,o);
    if (!bVar1) break;
    QList<QObject_*>::const_iterator::operator*(&local_28);
    QList<const_QObject_*>::append((QList<const_QObject_*> *)0x42c415,in_stack_ffffffffffffff98);
    QList<QObject_*>::const_iterator::operator++(&local_28);
  }
  QList<const_QObject_*>::append((QList<const_QObject_*> *)0x42c434,(parameter_type)&local_20);
  QHash<const_void_*,_QCss::StyleSheet>::remove
            (&styleSheetCaches->styleSheetCache,&stack0xffffffffffffffc0);
  updateObjects(in_RSI);
  QList<const_QObject_*>::~QList((QList<const_QObject_*> *)0x42c465);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::repolish(QWidget *w)
{
    QList<const QObject *> children;
    children.reserve(w->children().size() + 1);
    for (auto child: std::as_const(w->children()))
        children.append(child);
    children.append(w);
    styleSheetCaches->styleSheetCache.remove(w);
    updateObjects(children);
}